

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::SerializePartialToCodedStream
          (MessageLite *this,CodedOutputStream *output)

{
  bool bVar1;
  int size_00;
  int iVar2;
  int iVar3;
  int byte_size_after_serialization;
  uint8 *puVar4;
  undefined4 extraout_var;
  int final_byte_count;
  int original_byte_count;
  uint8 *end;
  uint8 *buffer;
  int size;
  CodedOutputStream *output_local;
  MessageLite *this_local;
  
  size_00 = (*this->_vptr_MessageLite[9])();
  puVar4 = io::CodedOutputStream::GetDirectBufferForNBytesAndAdvance(output,size_00);
  if (puVar4 == (uint8 *)0x0) {
    iVar2 = io::CodedOutputStream::ByteCount(output);
    (*this->_vptr_MessageLite[10])(this,output);
    bVar1 = io::CodedOutputStream::HadError(output);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      iVar3 = io::CodedOutputStream::ByteCount(output);
      if (iVar3 - iVar2 != size_00) {
        byte_size_after_serialization = (*this->_vptr_MessageLite[9])();
        anon_unknown_9::ByteSizeConsistencyError
                  (size_00,byte_size_after_serialization,iVar3 - iVar2);
      }
      this_local._7_1_ = true;
    }
  }
  else {
    iVar2 = (*this->_vptr_MessageLite[0xb])(this,puVar4);
    if (CONCAT44(extraout_var,iVar2) - (long)puVar4 != (long)size_00) {
      iVar3 = (*this->_vptr_MessageLite[9])();
      anon_unknown_9::ByteSizeConsistencyError(size_00,iVar3,iVar2 - (int)puVar4);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool MessageLite::SerializePartialToCodedStream(
    io::CodedOutputStream* output) const {
  const int size = ByteSize();  // Force size to be cached.
  uint8* buffer = output->GetDirectBufferForNBytesAndAdvance(size);
  if (buffer != NULL) {
    uint8* end = SerializeWithCachedSizesToArray(buffer);
    if (end - buffer != size) {
      ByteSizeConsistencyError(size, ByteSize(), end - buffer);
    }
    return true;
  } else {
    int original_byte_count = output->ByteCount();
    SerializeWithCachedSizes(output);
    if (output->HadError()) {
      return false;
    }
    int final_byte_count = output->ByteCount();

    if (final_byte_count - original_byte_count != size) {
      ByteSizeConsistencyError(size, ByteSize(),
                               final_byte_count - original_byte_count);
    }

    return true;
  }
}